

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::FileOptions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  string *psVar2;
  FileOptions **v1;
  FileOptions **v2;
  LogMessage *pLVar3;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *other;
  uint32_t *puVar4;
  Arena *pAVar5;
  FeatureSet *pFVar6;
  anon_union_160_1_493b367e_for_FileOptions_11 *this_00;
  FileOptions *pFVar7;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  LogMessageFatal local_190 [23];
  Voidify local_179;
  uint local_178;
  uint32_t cached_has_bits;
  undefined1 local_168 [16];
  LogMessageFatal local_158 [23];
  Voidify local_141;
  FileOptions *local_140;
  string *local_138;
  string *absl_log_internal_check_op_result;
  Arena *arena;
  FileOptions *from;
  FileOptions *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  string *local_100;
  string *local_f8;
  FileOptions *local_f0;
  anon_union_160_1_493b367e_for_FileOptions_11 *local_e8;
  string *local_e0;
  FileOptions *local_d8;
  anon_union_160_1_493b367e_for_FileOptions_11 *local_d0;
  string *local_c8;
  FileOptions *local_c0;
  anon_union_160_1_493b367e_for_FileOptions_11 *local_b8;
  string *local_b0;
  FileOptions *local_a8;
  anon_union_160_1_493b367e_for_FileOptions_11 *local_a0;
  string *local_98;
  FileOptions *local_90;
  anon_union_160_1_493b367e_for_FileOptions_11 *local_88;
  string *local_80;
  FileOptions *local_78;
  anon_union_160_1_493b367e_for_FileOptions_11 *local_70;
  string *local_68;
  FileOptions *local_60;
  anon_union_160_1_493b367e_for_FileOptions_11 *local_58;
  string *local_50;
  FileOptions *local_48;
  anon_union_160_1_493b367e_for_FileOptions_11 *local_40;
  string *local_38;
  FileOptions *local_30;
  anon_union_160_1_493b367e_for_FileOptions_11 *local_28;
  string *local_20;
  FileOptions *local_18;
  anon_union_160_1_493b367e_for_FileOptions_11 *local_10;
  
  arena = (Arena *)from_msg;
  from = (FileOptions *)to_msg;
  _this = (FileOptions *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result = (string *)MessageLite::GetArena(to_msg);
  local_140 = (FileOptions *)arena;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::FileOptions_const*>
                 (&local_140);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::FileOptions*>
                 (&from);
  local_138 = absl::lts_20240722::log_internal::
              Check_NEImpl<google::protobuf::FileOptions_const*,google::protobuf::FileOptions*>
                        (v1,v2,"&from != _this");
  if (local_138 != (string *)0x0) {
    local_168 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_138);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.pb.cc"
               ,0x2283,local_168._0_8_,local_168._8_8_);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_158);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_141,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_158);
  }
  local_178 = 0;
  this = _internal_mutable_uninterpreted_option(from);
  other = _internal_uninterpreted_option((FileOptions *)arena);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom(this,other);
  puVar4 = internal::HasBits<1>::operator[]((HasBits<1> *)&(arena->impl_).first_owner_,0);
  pFVar7 = from;
  local_178 = *puVar4;
  if ((local_178 & 0xff) != 0) {
    if ((local_178 & 1) != 0) {
      local_f8 = _internal_java_package_abi_cxx11_((FileOptions *)arena);
      local_f0 = pFVar7;
      local_e8 = &pFVar7->field_0;
      puVar4 = internal::HasBits<1>::operator[](&(pFVar7->field_0)._impl_._has_bits_,0);
      psVar2 = local_f8;
      *puVar4 = *puVar4 | 1;
      pAVar5 = MessageLite::GetArena((MessageLite *)pFVar7);
      internal::ArenaStringPtr::Set<>(&(pFVar7->field_0)._impl_.java_package_,psVar2,pAVar5);
    }
    pFVar7 = from;
    if ((local_178 & 2) != 0) {
      local_e0 = _internal_java_outer_classname_abi_cxx11_((FileOptions *)arena);
      local_d8 = pFVar7;
      local_d0 = &pFVar7->field_0;
      puVar4 = internal::HasBits<1>::operator[](&(pFVar7->field_0)._impl_._has_bits_,0);
      psVar2 = local_e0;
      *puVar4 = *puVar4 | 2;
      pAVar5 = MessageLite::GetArena((MessageLite *)pFVar7);
      internal::ArenaStringPtr::Set<>(&(pFVar7->field_0)._impl_.java_outer_classname_,psVar2,pAVar5)
      ;
    }
    pFVar7 = from;
    if ((local_178 & 4) != 0) {
      local_c8 = _internal_go_package_abi_cxx11_((FileOptions *)arena);
      local_c0 = pFVar7;
      local_b8 = &pFVar7->field_0;
      puVar4 = internal::HasBits<1>::operator[](&(pFVar7->field_0)._impl_._has_bits_,0);
      psVar2 = local_c8;
      *puVar4 = *puVar4 | 4;
      pAVar5 = MessageLite::GetArena((MessageLite *)pFVar7);
      internal::ArenaStringPtr::Set<>(&(pFVar7->field_0)._impl_.go_package_,psVar2,pAVar5);
    }
    pFVar7 = from;
    if ((local_178 & 8) != 0) {
      local_b0 = _internal_objc_class_prefix_abi_cxx11_((FileOptions *)arena);
      local_a8 = pFVar7;
      local_a0 = &pFVar7->field_0;
      puVar4 = internal::HasBits<1>::operator[](&(pFVar7->field_0)._impl_._has_bits_,0);
      psVar2 = local_b0;
      *puVar4 = *puVar4 | 8;
      pAVar5 = MessageLite::GetArena((MessageLite *)pFVar7);
      internal::ArenaStringPtr::Set<>(&(pFVar7->field_0)._impl_.objc_class_prefix_,psVar2,pAVar5);
    }
    pFVar7 = from;
    if ((local_178 & 0x10) != 0) {
      local_98 = _internal_csharp_namespace_abi_cxx11_((FileOptions *)arena);
      local_90 = pFVar7;
      local_88 = &pFVar7->field_0;
      puVar4 = internal::HasBits<1>::operator[](&(pFVar7->field_0)._impl_._has_bits_,0);
      psVar2 = local_98;
      *puVar4 = *puVar4 | 0x10;
      pAVar5 = MessageLite::GetArena((MessageLite *)pFVar7);
      internal::ArenaStringPtr::Set<>(&(pFVar7->field_0)._impl_.csharp_namespace_,psVar2,pAVar5);
    }
    pFVar7 = from;
    if ((local_178 & 0x20) != 0) {
      local_80 = _internal_swift_prefix_abi_cxx11_((FileOptions *)arena);
      local_78 = pFVar7;
      local_70 = &pFVar7->field_0;
      puVar4 = internal::HasBits<1>::operator[](&(pFVar7->field_0)._impl_._has_bits_,0);
      psVar2 = local_80;
      *puVar4 = *puVar4 | 0x20;
      pAVar5 = MessageLite::GetArena((MessageLite *)pFVar7);
      internal::ArenaStringPtr::Set<>(&(pFVar7->field_0)._impl_.swift_prefix_,psVar2,pAVar5);
    }
    pFVar7 = from;
    if ((local_178 & 0x40) != 0) {
      local_68 = _internal_php_class_prefix_abi_cxx11_((FileOptions *)arena);
      local_60 = pFVar7;
      local_58 = &pFVar7->field_0;
      puVar4 = internal::HasBits<1>::operator[](&(pFVar7->field_0)._impl_._has_bits_,0);
      psVar2 = local_68;
      *puVar4 = *puVar4 | 0x40;
      pAVar5 = MessageLite::GetArena((MessageLite *)pFVar7);
      internal::ArenaStringPtr::Set<>(&(pFVar7->field_0)._impl_.php_class_prefix_,psVar2,pAVar5);
    }
    pFVar7 = from;
    if ((local_178 & 0x80) != 0) {
      local_50 = _internal_php_namespace_abi_cxx11_((FileOptions *)arena);
      local_48 = pFVar7;
      local_40 = &pFVar7->field_0;
      puVar4 = internal::HasBits<1>::operator[](&(pFVar7->field_0)._impl_._has_bits_,0);
      psVar2 = local_50;
      *puVar4 = *puVar4 | 0x80;
      pAVar5 = MessageLite::GetArena((MessageLite *)pFVar7);
      internal::ArenaStringPtr::Set<>(&(pFVar7->field_0)._impl_.php_namespace_,psVar2,pAVar5);
    }
  }
  pFVar7 = from;
  if ((local_178 & 0xff00) != 0) {
    if ((local_178 & 0x100) != 0) {
      local_38 = _internal_php_metadata_namespace_abi_cxx11_((FileOptions *)arena);
      local_30 = pFVar7;
      local_28 = &pFVar7->field_0;
      puVar4 = internal::HasBits<1>::operator[](&(pFVar7->field_0)._impl_._has_bits_,0);
      psVar2 = local_38;
      *puVar4 = *puVar4 | 0x100;
      pAVar5 = MessageLite::GetArena((MessageLite *)pFVar7);
      internal::ArenaStringPtr::Set<>
                (&(pFVar7->field_0)._impl_.php_metadata_namespace_,psVar2,pAVar5);
    }
    pFVar7 = from;
    if ((local_178 & 0x200) != 0) {
      local_20 = _internal_ruby_package_abi_cxx11_((FileOptions *)arena);
      local_18 = pFVar7;
      local_10 = &pFVar7->field_0;
      puVar4 = internal::HasBits<1>::operator[](&(pFVar7->field_0)._impl_._has_bits_,0);
      psVar2 = local_20;
      *puVar4 = *puVar4 | 0x200;
      pAVar5 = MessageLite::GetArena((MessageLite *)pFVar7);
      internal::ArenaStringPtr::Set<>(&(pFVar7->field_0)._impl_.ruby_package_,psVar2,pAVar5);
    }
    if ((local_178 & 0x400) != 0) {
      if (*(long *)&(arena->impl_).first_arena_.cached_block_length_ == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_1a0,"from._impl_.features_ != nullptr");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_190,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.pb.cc"
                   ,0x22ac,local_1a0._M_len,local_1a0._M_str);
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_190);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_179,pLVar3);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_190);
      }
      if ((from->field_0)._impl_.features_ == (FeatureSet *)0x0) {
        to_msg_local = *(MessageLite **)&(arena->impl_).first_arena_.cached_block_length_;
        local_100 = absl_log_internal_check_op_result;
        pFVar6 = (FeatureSet *)
                 Arena::CopyConstruct<google::protobuf::FeatureSet>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.features_ = pFVar6;
      }
      else {
        FeatureSet::MergeFrom
                  ((from->field_0)._impl_.features_,
                   *(FeatureSet **)&(arena->impl_).first_arena_.cached_block_length_);
      }
    }
    if ((local_178 & 0x800) != 0) {
      (from->field_0)._impl_.java_multiple_files_ =
           (bool)(*(byte *)&(arena->impl_).first_arena_.cached_blocks_ & 1);
    }
    if ((local_178 & 0x1000) != 0) {
      (from->field_0)._impl_.java_generate_equals_and_hash_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cached_blocks_ + 1) & 1);
    }
    if ((local_178 & 0x2000) != 0) {
      (from->field_0)._impl_.java_string_check_utf8_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cached_blocks_ + 2) & 1);
    }
    if ((local_178 & 0x4000) != 0) {
      (from->field_0)._impl_.cc_generic_services_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cached_blocks_ + 3) & 1);
    }
    if ((local_178 & 0x8000) != 0) {
      (from->field_0)._impl_.java_generic_services_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cached_blocks_ + 4) & 1);
    }
  }
  uVar1 = local_178;
  if ((local_178 & 0xf0000) != 0) {
    if ((local_178 & 0x10000) != 0) {
      (from->field_0)._impl_.py_generic_services_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cached_blocks_ + 5) & 1);
    }
    if ((local_178 & 0x20000) != 0) {
      (from->field_0)._impl_.deprecated_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cached_blocks_ + 6) & 1);
    }
    if ((local_178 & 0x40000) != 0) {
      (from->field_0)._impl_.optimize_for_ = (int)arena[1].impl_.tag_and_id_;
    }
    if ((local_178 & 0x80000) != 0) {
      (from->field_0)._impl_.cc_enable_arenas_ =
           (bool)(*(byte *)((long)&arena[1].impl_.tag_and_id_ + 4) & 1);
    }
  }
  puVar4 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar4 = uVar1 | *puVar4;
  this_00 = &from->field_0;
  pFVar7 = internal_default_instance();
  internal::ExtensionSet::MergeFrom
            (&(this_00->_impl_)._extensions_,(MessageLite *)pFVar7,
             (ExtensionSet *)&(arena->impl_).field_0x10);
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void FileOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FileOptions*>(&to_msg);
  auto& from = static_cast<const FileOptions&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_uninterpreted_option()->MergeFrom(
      from._internal_uninterpreted_option());
  cached_has_bits = from._impl_._has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      _this->_internal_set_java_package(from._internal_java_package());
    }
    if (cached_has_bits & 0x00000002u) {
      _this->_internal_set_java_outer_classname(from._internal_java_outer_classname());
    }
    if (cached_has_bits & 0x00000004u) {
      _this->_internal_set_go_package(from._internal_go_package());
    }
    if (cached_has_bits & 0x00000008u) {
      _this->_internal_set_objc_class_prefix(from._internal_objc_class_prefix());
    }
    if (cached_has_bits & 0x00000010u) {
      _this->_internal_set_csharp_namespace(from._internal_csharp_namespace());
    }
    if (cached_has_bits & 0x00000020u) {
      _this->_internal_set_swift_prefix(from._internal_swift_prefix());
    }
    if (cached_has_bits & 0x00000040u) {
      _this->_internal_set_php_class_prefix(from._internal_php_class_prefix());
    }
    if (cached_has_bits & 0x00000080u) {
      _this->_internal_set_php_namespace(from._internal_php_namespace());
    }
  }
  if (cached_has_bits & 0x0000ff00u) {
    if (cached_has_bits & 0x00000100u) {
      _this->_internal_set_php_metadata_namespace(from._internal_php_metadata_namespace());
    }
    if (cached_has_bits & 0x00000200u) {
      _this->_internal_set_ruby_package(from._internal_ruby_package());
    }
    if (cached_has_bits & 0x00000400u) {
      ABSL_DCHECK(from._impl_.features_ != nullptr);
      if (_this->_impl_.features_ == nullptr) {
        _this->_impl_.features_ =
            ::google::protobuf::Message::CopyConstruct<::google::protobuf::FeatureSet>(arena, *from._impl_.features_);
      } else {
        _this->_impl_.features_->MergeFrom(*from._impl_.features_);
      }
    }
    if (cached_has_bits & 0x00000800u) {
      _this->_impl_.java_multiple_files_ = from._impl_.java_multiple_files_;
    }
    if (cached_has_bits & 0x00001000u) {
      _this->_impl_.java_generate_equals_and_hash_ = from._impl_.java_generate_equals_and_hash_;
    }
    if (cached_has_bits & 0x00002000u) {
      _this->_impl_.java_string_check_utf8_ = from._impl_.java_string_check_utf8_;
    }
    if (cached_has_bits & 0x00004000u) {
      _this->_impl_.cc_generic_services_ = from._impl_.cc_generic_services_;
    }
    if (cached_has_bits & 0x00008000u) {
      _this->_impl_.java_generic_services_ = from._impl_.java_generic_services_;
    }
  }
  if (cached_has_bits & 0x000f0000u) {
    if (cached_has_bits & 0x00010000u) {
      _this->_impl_.py_generic_services_ = from._impl_.py_generic_services_;
    }
    if (cached_has_bits & 0x00020000u) {
      _this->_impl_.deprecated_ = from._impl_.deprecated_;
    }
    if (cached_has_bits & 0x00040000u) {
      _this->_impl_.optimize_for_ = from._impl_.optimize_for_;
    }
    if (cached_has_bits & 0x00080000u) {
      _this->_impl_.cc_enable_arenas_ = from._impl_.cc_enable_arenas_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(internal_default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}